

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::Normalizer2Impl::decompose
          (Normalizer2Impl *this,UnicodeString *src,UnicodeString *dest,UErrorCode *errorCode)

{
  ushort uVar1;
  char16_t *src_00;
  int destLengthEstimate;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 0x11) == 0) {
      if ((uVar1 & 2) == 0) {
        src_00 = (src->fUnion).fFields.fArray;
      }
      else {
        src_00 = (src->fUnion).fStackFields.fBuffer;
      }
    }
    else {
      src_00 = (char16_t *)0x0;
    }
    if (dest != src && src_00 != (char16_t *)0x0) {
      if ((short)uVar1 < 0) {
        destLengthEstimate = (src->fUnion).fFields.fLength;
      }
      else {
        destLengthEstimate = (int)(short)uVar1 >> 5;
      }
      decompose(this,src_00,src_00 + destLengthEstimate,dest,destLengthEstimate,errorCode);
      return dest;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  icu_63::UnicodeString::setToBogus(dest);
  return dest;
}

Assistant:

UnicodeString &
Normalizer2Impl::decompose(const UnicodeString &src, UnicodeString &dest,
                           UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        dest.setToBogus();
        return dest;
    }
    const UChar *sArray=src.getBuffer();
    if(&dest==&src || sArray==NULL) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        dest.setToBogus();
        return dest;
    }
    decompose(sArray, sArray+src.length(), dest, src.length(), errorCode);
    return dest;
}